

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_mark(bitstream *str,uint32_t val,int size)

{
  int iVar1;
  uint32_t tmp;
  
  tmp = val;
  iVar1 = vs_u(str,&tmp,size);
  if (iVar1 == 0) {
    if (tmp == val) {
      return 0;
    }
    fprintf(_stderr,"Marker value invalid: %d vs %d\n",(ulong)tmp,val);
  }
  return 1;
}

Assistant:

int vs_mark(struct bitstream *str, uint32_t val, int size) {
	uint32_t tmp = val;
	if (vs_u(str, &tmp, size)) return 1;
	if (tmp != val) {
		fprintf(stderr, "Marker value invalid: %d vs %d\n", tmp, val);
		return 1;
	}
	return 0;
}